

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writeFileSetDescriptor(IsoWriter *this)

{
  uint32_t tagLocation;
  size_t __n;
  undefined1 local_30 [8];
  ByteFileWriter writer;
  IsoWriter *this_local;
  
  writer.m_tagPos = (uint8_t *)this;
  memset(this->m_buffer,0,0x800);
  ByteFileWriter::ByteFileWriter((ByteFileWriter *)local_30);
  ByteFileWriter::setBuffer((ByteFileWriter *)local_30,this->m_buffer,0x800);
  tagLocation = absoluteSectorNum(this);
  ByteFileWriter::writeDescriptorTag((ByteFileWriter *)local_30,FileSet,tagLocation);
  ByteFileWriter::writeTimestamp((ByteFileWriter *)local_30,this->m_currentTime);
  ByteFileWriter::writeLE16((ByteFileWriter *)local_30,3);
  ByteFileWriter::writeLE16((ByteFileWriter *)local_30,3);
  ByteFileWriter::writeLE32((ByteFileWriter *)local_30,1);
  ByteFileWriter::writeLE32((ByteFileWriter *)local_30,1);
  ByteFileWriter::writeLE32((ByteFileWriter *)local_30,0);
  ByteFileWriter::writeLE32((ByteFileWriter *)local_30,0);
  ByteFileWriter::writeCharSpecString((ByteFileWriter *)local_30,"OSTA Compressed Unicode",0x40);
  ByteFileWriter::writeDString((ByteFileWriter *)local_30,&this->m_volumeLabel,0x80);
  ByteFileWriter::writeCharSpecString((ByteFileWriter *)local_30,"OSTA Compressed Unicode",0x40);
  ByteFileWriter::writeDString((ByteFileWriter *)local_30,&this->m_volumeLabel,0x20);
  ByteFileWriter::skipBytes((ByteFileWriter *)local_30,0x20);
  ByteFileWriter::skipBytes((ByteFileWriter *)local_30,0x20);
  ByteFileWriter::writeLongAD((ByteFileWriter *)local_30,0x800,2,1,0);
  ByteFileWriter::writeUDFString((ByteFileWriter *)local_30,"*OSTA UDF Compliant",0x20);
  this->m_buffer[0x1ba] = '\x03';
  ByteFileWriter::writeLongAD((ByteFileWriter *)local_30,0,0,0,0);
  __n = 1;
  ByteFileWriter::writeLongAD((ByteFileWriter *)local_30,0x800,this->m_systemStreamLBN,1,0);
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0x200);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,__n);
  return;
}

Assistant:

void IsoWriter::writeFileSetDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));

    ByteFileWriter writer;
    writer.setBuffer(m_buffer, sizeof(m_buffer));
    writer.writeDescriptorTag(DescriptorTag::FileSet, absoluteSectorNum());

    writer.writeTimestamp(m_currentTime);  // Recording Date and Time
    writer.writeLE16(0x03);                // Interchange Level
    writer.writeLE16(0x03);                // Maximum Interchange Level
    writer.writeLE32(0x01);                // Character Set List
    writer.writeLE32(0x01);                // Maximum Character Set List
    writer.writeLE32(0x00);                // File Set Number
    writer.writeLE32(0x00);                // File Set Descriptor Number
    writer.writeCharSpecString("OSTA Compressed Unicode", 64);
    writer.writeDString(m_volumeLabel, 128);                    // Logical Volume Identifier
    writer.writeCharSpecString("OSTA Compressed Unicode", 64);  // File Set Character Set
    writer.writeDString(m_volumeLabel, 32);                     // File Set Identifier
    writer.skipBytes(32);                                       // Copyright File Identifier
    writer.skipBytes(32);                                       // Abstract File Identifier
    writer.writeLongAD(0x0800, 2, 1, 0);                        // Root Directory ICB
    writer.writeUDFString("*OSTA UDF Compliant", 32);           // Domain Identifier
    m_buffer[442] = 0x03;                                       // Domain Flags: Hard and Soft Write-Protect
    writer.writeLongAD(0, 0, 0, 0);                             // Next Extent
    writer.writeLongAD(0x0800, m_systemStreamLBN, 1, 0);

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}